

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_range_glyph_count(nk_rune *range,int count)

{
  nk_rune t;
  nk_rune f;
  int diff;
  int total_glyphs;
  int i;
  int count_local;
  nk_rune *range_local;
  
  f = 0;
  diff = 0;
  while( true ) {
    if (count <= diff) {
      return f;
    }
    if (range[diff * 2 + 1] < range[diff << 1]) break;
    f = (range[diff * 2 + 1] - range[diff << 1]) + 1 + f;
    diff = diff + 1;
  }
  __assert_fail("t >= f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x3101,"int nk_range_glyph_count(const nk_rune *, int)");
}

Assistant:

NK_INTERN int
nk_range_glyph_count(const nk_rune *range, int count)
{
    int i = 0;
    int total_glyphs = 0;
    for (i = 0; i < count; ++i) {
        int diff;
        nk_rune f = range[(i*2)+0];
        nk_rune t = range[(i*2)+1];
        NK_ASSERT(t >= f);
        diff = (int)((t - f) + 1);
        total_glyphs += diff;
    }
    return total_glyphs;
}